

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterBeginAddColumn(Parse *pParse,SrcList *pSrc)

{
  undefined8 *puVar1;
  short sVar2;
  uint uVar3;
  sqlite3 *db;
  int iVar4;
  uint uVar5;
  Table *pTVar6;
  Table *pTVar7;
  Column *pCVar8;
  Vdbe *pVVar9;
  Schema **ppSVar10;
  long lVar11;
  char *pcVar12;
  Parse *pPVar13;
  ulong uVar14;
  long lVar15;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    pTVar6 = sqlite3LocateTableItem(pParse,0,pSrc->a);
    if (pTVar6 != (Table *)0x0) {
      if ((pTVar6->tabFlags & 0x10) == 0) {
        if (pTVar6->pSelect == (Select *)0x0) {
          iVar4 = isSystemTable(pParse,pTVar6->zName);
          if (iVar4 == 0) {
            if (pTVar6->pSchema == (Schema *)0x0) {
              uVar14 = 0xfff0bdc0;
            }
            else {
              uVar3 = db->nDb;
              if ((int)uVar3 < 1) {
                uVar14 = 0;
              }
              else {
                ppSVar10 = &db->aDb->pSchema;
                uVar14 = 0;
                do {
                  if (*ppSVar10 == pTVar6->pSchema) goto LAB_00184541;
                  uVar14 = uVar14 + 1;
                  ppSVar10 = ppSVar10 + 4;
                } while (uVar3 != uVar14);
                uVar14 = (ulong)uVar3;
              }
            }
LAB_00184541:
            pTVar7 = (Table *)sqlite3DbMallocRaw(db,0x78);
            if (pTVar7 != (Table *)0x0) {
              pTVar7->pTrigger = (Trigger *)0x0;
              pTVar7->pSchema = (Schema *)0x0;
              pTVar7->azModuleArg = (char **)0x0;
              pTVar7->pVTable = (VTable *)0x0;
              pTVar7->iPKey = 0;
              pTVar7->nCol = 0;
              pTVar7->nRef = 0;
              pTVar7->tabFlags = '\0';
              pTVar7->keyConf = '\0';
              pTVar7->addColOffset = 0;
              pTVar7->nModuleArg = 0;
              pTVar7->pCheck = (ExprList *)0x0;
              pTVar7->nRowEst = 0;
              pTVar7->tnum = 0;
              pTVar7->pFKey = (FKey *)0x0;
              pTVar7->zColAff = (char *)0x0;
              pTVar7->pIndex = (Index *)0x0;
              pTVar7->pSelect = (Select *)0x0;
              pTVar7->zName = (char *)0x0;
              pTVar7->aCol = (Column *)0x0;
              pTVar7->pNextZombie = (Table *)0x0;
              pParse->pNewTable = pTVar7;
              pTVar7->nRef = 1;
              sVar2 = pTVar6->nCol;
              pTVar7->nCol = sVar2;
              uVar3 = (int)sVar2 - 1;
              uVar5 = (int)sVar2 + 6;
              if (-1 < (int)uVar3) {
                uVar5 = uVar3;
              }
              iVar4 = (uVar5 >> 3) * 0x180 + 0x180;
              pCVar8 = (Column *)sqlite3DbMallocRaw(db,iVar4);
              if (pCVar8 != (Column *)0x0) {
                memset(pCVar8,0,(long)iVar4);
              }
              pTVar7->aCol = pCVar8;
              pcVar12 = sqlite3MPrintf(db,"sqlite_altertab_%s",pTVar6->zName);
              pTVar7->zName = pcVar12;
              if (pcVar12 == (char *)0x0 || pTVar7->aCol == (Column *)0x0) {
                db->mallocFailed = '\x01';
              }
              else {
                memcpy(pTVar7->aCol,pTVar6->aCol,(long)pTVar7->nCol * 0x30);
                if (0 < pTVar7->nCol) {
                  lVar11 = 0;
                  lVar15 = 0;
                  do {
                    pCVar8 = pTVar7->aCol;
                    pcVar12 = sqlite3DbStrDup(db,*(char **)((long)&pCVar8->zName + lVar11));
                    *(char **)((long)&pCVar8->zName + lVar11) = pcVar12;
                    lVar15 = lVar15 + 1;
                    puVar1 = (undefined8 *)((long)&pCVar8->pDflt + lVar11);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    puVar1 = (undefined8 *)((long)&pCVar8->zType + lVar11);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    lVar11 = lVar11 + 0x30;
                  } while (lVar15 < pTVar7->nCol);
                }
                iVar4 = (int)uVar14;
                pTVar7->pSchema = db->aDb[iVar4].pSchema;
                pTVar7->addColOffset = pTVar6->addColOffset;
                pTVar7->nRef = 1;
                pPVar13 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar13 = pParse;
                }
                sqlite3CodeVerifySchema(pParse,iVar4);
                pPVar13->writeMask = pPVar13->writeMask | 1 << ((byte)uVar14 & 0x1f);
                pVVar9 = sqlite3GetVdbe(pParse);
                if (pVVar9 != (Vdbe *)0x0) {
                  sqlite3ChangeCookie(pParse,iVar4);
                }
              }
            }
          }
          goto LAB_001844da;
        }
        pcVar12 = "Cannot add a column to a view";
      }
      else {
        pcVar12 = "virtual tables may not be altered";
      }
      sqlite3ErrorMsg(pParse,pcVar12);
    }
  }
LAB_001844da:
  sqlite3SrcListDelete(db,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterBeginAddColumn(Parse *pParse, SrcList *pSrc){
  Table *pNew;
  Table *pTab;
  Vdbe *v;
  int iDb;
  int i;
  int nAlloc;
  sqlite3 *db = pParse->db;

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( db->mallocFailed ) goto exit_begin_add_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_begin_add_column;

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be altered");
    goto exit_begin_add_column;
  }
#endif

  /* Make sure this is not an attempt to ALTER a view. */
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "Cannot add a column to a view");
    goto exit_begin_add_column;
  }
  if( SQLITE_OK!=isSystemTable(pParse, pTab->zName) ){
    goto exit_begin_add_column;
  }

  assert( pTab->addColOffset>0 );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

  /* Put a copy of the Table struct in Parse.pNewTable for the
  ** sqlite3AddColumn() function and friends to modify.  But modify
  ** the name by adding an "sqlite_altertab_" prefix.  By adding this
  ** prefix, we insure that the name will not collide with an existing
  ** table because user table are not allowed to have the "sqlite_"
  ** prefix on their name.
  */
  pNew = (Table*)sqlite3DbMallocZero(db, sizeof(Table));
  if( !pNew ) goto exit_begin_add_column;
  pParse->pNewTable = pNew;
  pNew->nRef = 1;
  pNew->nCol = pTab->nCol;
  assert( pNew->nCol>0 );
  nAlloc = (((pNew->nCol-1)/8)*8)+8;
  assert( nAlloc>=pNew->nCol && nAlloc%8==0 && nAlloc-pNew->nCol<8 );
  pNew->aCol = (Column*)sqlite3DbMallocZero(db, sizeof(Column)*nAlloc);
  pNew->zName = sqlite3MPrintf(db, "sqlite_altertab_%s", pTab->zName);
  if( !pNew->aCol || !pNew->zName ){
    db->mallocFailed = 1;
    goto exit_begin_add_column;
  }
  memcpy(pNew->aCol, pTab->aCol, sizeof(Column)*pNew->nCol);
  for(i=0; i<pNew->nCol; i++){
    Column *pCol = &pNew->aCol[i];
    pCol->zName = sqlite3DbStrDup(db, pCol->zName);
    pCol->zColl = 0;
    pCol->zType = 0;
    pCol->pDflt = 0;
    pCol->zDflt = 0;
  }
  pNew->pSchema = db->aDb[iDb].pSchema;
  pNew->addColOffset = pTab->addColOffset;
  pNew->nRef = 1;

  /* Begin a transaction and increment the schema cookie.  */
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  v = sqlite3GetVdbe(pParse);
  if( !v ) goto exit_begin_add_column;
  sqlite3ChangeCookie(pParse, iDb);

exit_begin_add_column:
  sqlite3SrcListDelete(db, pSrc);
  return;
}